

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  ulong *puVar4;
  TestError *pTVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  long *local_108;
  long local_f8;
  long lStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string base_variable_string;
  string base_var_type;
  string shader_source;
  
  if (supported_variable_types_map._16_8_ != 0) {
    iVar1 = *(int *)Interface::GL::var_types;
    lVar7 = 0x21f1cb8;
    lVar2 = supported_variable_types_map._16_8_;
    do {
      if (iVar1 <= *(int *)(lVar2 + 0x20)) {
        lVar7 = lVar2;
      }
      lVar2 = *(long *)(lVar2 + 0x10 + (ulong)(*(int *)(lVar2 + 0x20) < iVar1) * 8);
    } while (lVar2 != 0);
    if ((lVar7 != 0x21f1cb8) && (*(int *)(lVar7 + 0x20) <= iVar1)) {
      base_var_type._M_dataplus._M_p = (pointer)&base_var_type.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&base_var_type,*(long *)(lVar7 + 0x28),
                 *(long *)(lVar7 + 0x30) + *(long *)(lVar7 + 0x28));
      base_variable_string._M_dataplus._M_p = (pointer)&base_variable_string.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&base_variable_string,base_var_type._M_dataplus._M_p,
                 base_var_type._M_dataplus._M_p + base_var_type._M_string_length);
      uVar8 = 0;
      shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&shader_source,0x1af8059);
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,shader_start_abi_cxx11_,DAT_021ec698 + shader_start_abi_cxx11_);
      std::__cxx11::string::append((char *)&__str);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&__str,(ulong)base_variable_string._M_dataplus._M_p);
      local_c8 = &local_b8;
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_b8 = *plVar6;
        lStack_b0 = plVar3[3];
      }
      else {
        local_b8 = *plVar6;
        local_c8 = (long *)*plVar3;
      }
      local_c0 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_108 = &local_f8;
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_f8 = *plVar6;
        lStack_f0 = plVar3[3];
      }
      else {
        local_f8 = *plVar6;
        local_108 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_108);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      do {
        std::__cxx11::string::append((char *)&shader_source);
        uVar8 = uVar8 + 1;
      } while (uVar8 < 2);
      std::__cxx11::string::append((char *)&shader_source);
      if (tested_shader_type < SHADER_TYPE_LAST) {
        puVar4 = &set_tesseation_abi_cxx11_;
        switch((ulong)tested_shader_type) {
        case 1:
          std::__cxx11::string::append((char *)&shader_source);
          break;
        case 3:
          puVar4 = &emit_quad_abi_cxx11_;
        case 4:
          std::__cxx11::string::_M_append((char *)&shader_source,*puVar4);
        }
        std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
        (*(code *)(&DAT_01ad38a4 + *(int *)(&DAT_01ad38a4 + (ulong)tested_shader_type * 4)))
                  (&DAT_01ad38a4 + *(int *)(&DAT_01ad38a4 + (ulong)tested_shader_type * 4),
                   empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
                   empty_string_abi_cxx11_,empty_string_abi_cxx11_);
        return;
      }
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x51d);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x529);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SizedDeclarationsPrimitive<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			/* Loop round for each var_types ("int", "uint", "float", etc.)
			 * We are testing a[][] to a [][][][][][][][], so start counter at 2. */
			for (size_t max_dimension_limit = 2; max_dimension_limit <= API::MAX_ARRAY_DIMENSIONS;
				 max_dimension_limit++)
			{
				// Record the base varTypeModifier + varType
				std::string base_var_type		 = var_iterator->second.type;
				std::string base_variable_string = base_var_type;

				for (size_t base_sub_script_index = 0; base_sub_script_index <= max_dimension_limit;
					 base_sub_script_index++)
				{
					std::string shader_source = "";

					// Add the shader body start, and the base varTypeModifier + varType + variable name.
					shader_source += shader_start + "    " + base_variable_string + " a";

					for (size_t remaining_sub_script_index = base_sub_script_index;
						 remaining_sub_script_index < max_dimension_limit; remaining_sub_script_index++)
					{
						/* Add as many array sub_scripts as we can, up to the current dimension limit. */
						shader_source += "[2]";
					}

					/* End line */
					shader_source += ";\n";

					/* End main */
					DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

					/* Execute test */
					EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);

					/* From now on, we'll have an extra sub_script each time. */
					base_variable_string += "[2]";
				} /* for (int base_sub_script_index = 0; ...) */
			}	 /* for (int max_dimension_limit = 2; ...) */
		}		  /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}